

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

Callback * __thiscall LiteScript::Callback::operator=(Callback *this,Callback *c)

{
  uint uVar1;
  
  uVar1 = c->line_num;
  this->intrl_idx = c->intrl_idx;
  this->line_num = uVar1;
  this->call_ptr = c->call_ptr;
  this->callIndex = c->callIndex;
  Nullable<LiteScript::Namer>::operator=(&this->nsp,&c->nsp);
  return this;
}

Assistant:

LiteScript::Callback & LiteScript::Callback::operator=(const Callback &c) {
    this->intrl_idx = c.intrl_idx;
    this->line_num = c.line_num;
    this->call_ptr = c.call_ptr;
    this->callIndex = c.callIndex;
    this->nsp = c.nsp;
    return *this;
}